

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Symbol(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this,Static_String *t_s,bool t_disallow_prevention)

{
  char *pcVar1;
  ulong t_distance;
  char *pcVar2;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  char *pcVar9;
  byte *pbVar10;
  ulong uVar11;
  size_t sVar12;
  bool bVar13;
  string_view t_str;
  string_view t_str_00;
  Depth_Counter dc;
  Depth_Counter local_50;
  char *local_48;
  undefined8 uStack_40;
  
  Depth_Counter::Depth_Counter(&local_50,this);
  SkipWS(this,false);
  iVar6 = (this->m_position).line;
  iVar7 = (this->m_position).col;
  pcVar1 = (this->m_position).m_pos;
  local_48 = (this->m_position).m_end;
  uStack_40 = *(undefined8 *)&(this->m_position).m_last_col;
  t_distance = t_s->m_size;
  pcVar2 = (this->m_position).m_pos;
  pcVar3 = (this->m_position).m_end;
  if ((ulong)((long)pcVar3 - (long)pcVar2) < t_distance) {
LAB_001b9c64:
    bVar13 = false;
  }
  else {
    pcVar9 = "";
    if (pcVar2 != pcVar3) {
      pcVar9 = pcVar2;
    }
    bVar13 = t_distance == 0;
    if (!bVar13) {
      uVar11 = 0;
      do {
        if (t_s->data[uVar11] != pcVar9[uVar11]) goto LAB_001b9c64;
        uVar11 = uVar11 + 1;
      } while (t_distance != uVar11);
      bVar13 = true;
    }
    Position::operator+=(&this->m_position,t_distance);
  }
  if (bVar13 != false) {
    pbVar4 = (byte *)(this->m_position).m_pos;
    pbVar5 = (byte *)(this->m_position).m_end;
    if ((pbVar4 != pbVar5 && !t_disallow_prevention) &&
       (m_alphabet._M_elems[0]._M_elems[*pbVar4] == true)) {
      pbVar10 = (byte *)0x205404;
      if (pbVar4 != pbVar5) {
        pbVar10 = pbVar4;
      }
      if (*pbVar10 != 0x3d) {
        sVar12 = (long)pbVar4 - (long)pcVar1;
        if (pcVar1 == (char *)0x0) {
          sVar12 = 0;
        }
        t_str._M_str = pcVar1;
        t_str._M_len = sVar12;
        bVar8 = Operator_Matches::is_match(&m_operator_matches,t_str);
        if (bVar8) {
          pcVar2 = (this->m_position).m_pos;
          pcVar9 = (char *)0x0;
          pcVar3 = pcVar9;
          if (pcVar2 != (char *)0x0 && pcVar1 != (char *)0x0) {
            pcVar9 = pcVar1;
            pcVar3 = pcVar2 + ((ulong)(pcVar2 != (this->m_position).m_end) - (long)pcVar1);
          }
          t_str_00._M_str = pcVar9;
          t_str_00._M_len = (size_t)pcVar3;
          bVar8 = Operator_Matches::is_match(&m_operator_matches,t_str_00);
          if (!bVar8) goto LAB_001b9d63;
        }
      }
      (this->m_position).line = iVar6;
      (this->m_position).col = iVar7;
      (this->m_position).m_pos = pcVar1;
      (this->m_position).m_last_col = (int)uStack_40;
      (this->m_position).m_end = local_48;
      bVar13 = false;
    }
  }
LAB_001b9d63:
  (local_50.parser)->m_current_parse_depth = (local_50.parser)->m_current_parse_depth - 1;
  return bVar13;
}

Assistant:

bool Symbol(const utility::Static_String &t_s, const bool t_disallow_prevention = false) {
        Depth_Counter dc{this};
        SkipWS();
        const auto start = m_position;
        bool retval = Symbol_(t_s);

        // ignore substring matches
        if (retval && m_position.has_more() && (t_disallow_prevention == false) && char_in_alphabet(*m_position, detail::symbol_alphabet)) {
          if (*m_position != '=' && is_operator(Position::str(start, m_position)) && !is_operator(Position::str(start, m_position + 1))) {
            // don't throw this away, it's a good match and the next is not
          } else {
            m_position = start;
            retval = false;
          }
        }

        return retval;
      }